

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  int iVar1;
  j_decompress_ptr cinfo_00;
  long *in_RDI;
  int ci;
  my_cconvert_ptr_conflict cconvert;
  int local_14;
  
  cinfo_00 = (j_decompress_ptr)(**(code **)in_RDI[1])(in_RDI,1,0x38);
  in_RDI[0x4d] = (long)cinfo_00;
  cinfo_00->err = (jpeg_error_mgr *)start_pass_dcolor;
  iVar1 = *(int *)((long)in_RDI + 0x3c);
  if (iVar1 == 1) {
    if ((int)in_RDI[7] != 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  else if (iVar1 - 2U < 2) {
    if ((int)in_RDI[7] != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  else if (iVar1 - 4U < 2) {
    if ((int)in_RDI[7] != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  else if ((int)in_RDI[7] < 1) {
    *(undefined4 *)(*in_RDI + 0x28) = 10;
    (**(code **)*in_RDI)(in_RDI);
  }
  switch((int)in_RDI[8]) {
  case 1:
    *(undefined4 *)(in_RDI + 0x12) = 1;
    if ((*(int *)((long)in_RDI + 0x3c) == 1) || (*(int *)((long)in_RDI + 0x3c) == 3)) {
      cinfo_00->mem = (jpeg_memory_mgr *)grayscale_convert;
      for (local_14 = 1; local_14 < (int)in_RDI[7]; local_14 = local_14 + 1) {
        *(undefined4 *)(in_RDI[0x26] + (long)local_14 * 0x60 + 0x30) = 0;
      }
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 2) {
      cinfo_00->mem = (jpeg_memory_mgr *)rgb_gray_convert;
      build_rgb_y_table(cinfo_00);
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 2:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    *(int *)(in_RDI + 0x12) = rgb_pixelsize[*(uint *)(in_RDI + 8)];
    if (*(int *)((long)in_RDI + 0x3c) == 3) {
      iVar1 = jsimd_can_ycc_rgb();
      if (iVar1 == 0) {
        cinfo_00->mem = (jpeg_memory_mgr *)ycc_rgb_convert;
        build_ycc_rgb_table(cinfo_00);
      }
      else {
        cinfo_00->mem = (jpeg_memory_mgr *)jsimd_ycc_rgb_convert;
      }
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 1) {
      cinfo_00->mem = (jpeg_memory_mgr *)gray_rgb_convert;
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 2) {
      if ((((rgb_red[*(uint *)(in_RDI + 8)] == 0) && (rgb_green[*(uint *)(in_RDI + 8)] == 1)) &&
          (rgb_blue[*(uint *)(in_RDI + 8)] == 2)) && (rgb_pixelsize[*(uint *)(in_RDI + 8)] == 3)) {
        cinfo_00->mem = (jpeg_memory_mgr *)null_convert;
      }
      else {
        cinfo_00->mem = (jpeg_memory_mgr *)rgb_rgb_convert;
      }
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  default:
    if ((int)in_RDI[8] == *(int *)((long)in_RDI + 0x3c)) {
      *(int *)(in_RDI + 0x12) = (int)in_RDI[7];
      cinfo_00->mem = (jpeg_memory_mgr *)null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 4:
    *(undefined4 *)(in_RDI + 0x12) = 4;
    if (*(int *)((long)in_RDI + 0x3c) == 5) {
      cinfo_00->mem = (jpeg_memory_mgr *)ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo_00);
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 4) {
      cinfo_00->mem = (jpeg_memory_mgr *)null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 0x10:
    *(undefined4 *)(in_RDI + 0x12) = 3;
    if ((int)in_RDI[0xe] == 0) {
      if (*(int *)((long)in_RDI + 0x3c) == 3) {
        iVar1 = jsimd_can_ycc_rgb565();
        if (iVar1 == 0) {
          cinfo_00->mem = (jpeg_memory_mgr *)ycc_rgb565_convert;
          build_ycc_rgb_table(cinfo_00);
        }
        else {
          cinfo_00->mem = (jpeg_memory_mgr *)jsimd_ycc_rgb565_convert;
        }
      }
      else if (*(int *)((long)in_RDI + 0x3c) == 1) {
        cinfo_00->mem = (jpeg_memory_mgr *)gray_rgb565_convert;
      }
      else if (*(int *)((long)in_RDI + 0x3c) == 2) {
        cinfo_00->mem = (jpeg_memory_mgr *)rgb_rgb565_convert;
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 3) {
      cinfo_00->mem = (jpeg_memory_mgr *)ycc_rgb565D_convert;
      build_ycc_rgb_table(cinfo_00);
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 1) {
      cinfo_00->mem = (jpeg_memory_mgr *)gray_rgb565D_convert;
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 2) {
      cinfo_00->mem = (jpeg_memory_mgr *)rgb_rgb565D_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  if (*(int *)((long)in_RDI + 0x6c) == 0) {
    *(int *)((long)in_RDI + 0x94) = (int)in_RDI[0x12];
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x94) = 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter(j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *)cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:                      /* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
        cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
        cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      if (jsimd_can_ycc_rgb())
        cconvert->pub.color_convert = jsimd_ycc_rgb_convert;
      else {
        cconvert->pub.color_convert = ycc_rgb_convert;
        build_ycc_rgb_table(cinfo);
      }
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      if (rgb_red[cinfo->out_color_space] == 0 &&
          rgb_green[cinfo->out_color_space] == 1 &&
          rgb_blue[cinfo->out_color_space] == 2 &&
          rgb_pixelsize[cinfo->out_color_space] == 3)
        cconvert->pub.color_convert = null_convert;
      else
        cconvert->pub.color_convert = rgb_rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB565:
    cinfo->out_color_components = 3;
    if (cinfo->dither_mode == JDITHER_NONE) {
      if (cinfo->jpeg_color_space == JCS_YCbCr) {
        if (jsimd_can_ycc_rgb565())
          cconvert->pub.color_convert = jsimd_ycc_rgb565_convert;
        else {
          cconvert->pub.color_convert = ycc_rgb565_convert;
          build_ycc_rgb_table(cinfo);
        }
      } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
        cconvert->pub.color_convert = gray_rgb565_convert;
      } else if (cinfo->jpeg_color_space == JCS_RGB) {
        cconvert->pub.color_convert = rgb_rgb565_convert;
      } else
        ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    } else {
      /* only ordered dithering is supported */
      if (cinfo->jpeg_color_space == JCS_YCbCr) {
        cconvert->pub.color_convert = ycc_rgb565D_convert;
        build_ycc_rgb_table(cinfo);
      } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
        cconvert->pub.color_convert = gray_rgb565D_convert;
      } else if (cinfo->jpeg_color_space == JCS_RGB) {
        cconvert->pub.color_convert = rgb_rgb565D_convert;
      } else
        ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    }
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else                      /* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}